

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnGlobal(SharedValidator *this,Location *loc,Type type,bool mutable_)

{
  pointer *ppGVar1;
  iterator __position;
  undefined8 in_RAX;
  GlobalType local_8;
  
  local_8._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
  local_8.mutable_ = mutable_;
  local_8.type.enum_ = type.enum_;
  __position._M_current =
       (this->globals_).
       super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->globals_).
      super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>::
    _M_realloc_insert<wabt::SharedValidator::GlobalType>(&this->globals_,__position,&local_8);
  }
  else {
    *__position._M_current = local_8;
    ppGVar1 = &(this->globals_).
               super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  return (Result)Ok;
}

Assistant:

Result SharedValidator::OnGlobal(const Location& loc,
                                 Type type,
                                 bool mutable_) {
  globals_.push_back(GlobalType{type, mutable_});
  return Result::Ok;
}